

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Mesh::draw(Mesh *this)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar1;
  float fVar2;
  Scene *pSVar3;
  double dVar4;
  _List_node_base *p_Var5;
  long lVar6;
  double in_XMM1_Qa;
  undefined4 uVar7;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> offsets;
  _Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> local_88;
  Vector3D local_68;
  undefined1 local_48 [16];
  double local_38;
  
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar1 = &(this->mesh).vertices;
  p_Var5 = (_List_node_base *)plVar1;
  while (p_Var5 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var5->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)plVar1) {
    fVar2 = *(float *)((long)&p_Var5[6]._M_prev + 4);
    Vertex::normal(&local_68,(Vertex *)(p_Var5 + 1));
    dVar4 = (double)fVar2;
    in_XMM1_Qa = local_68.z * dVar4;
    local_48._8_4_ = SUB84(dVar4 * local_68.y,0);
    local_48._0_8_ = dVar4 * local_68.x;
    local_48._12_4_ = (int)((ulong)(dVar4 * local_68.y) >> 0x20);
    local_38 = in_XMM1_Qa;
    std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
              ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)&local_88,
               (value_type *)local_48);
  }
  lVar6 = 0;
  p_Var5 = (_List_node_base *)plVar1;
  while( true ) {
    uVar7 = (undefined4)((ulong)in_XMM1_Qa >> 0x20);
    p_Var5 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var5->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)plVar1) break;
    Vector3D::operator+=
              ((Vector3D *)&p_Var5[1]._M_prev,
               (Vector3D *)((long)&(local_88._M_impl.super__Vector_impl_data._M_start)->x + lVar6));
    lVar6 = lVar6 + 0x18;
  }
  glPushMatrix();
  glTranslatef((float)(this->super_SceneObject).position.x,
               CONCAT44(uVar7,(float)(this->super_SceneObject).position.y),
               (float)(this->super_SceneObject).position.z);
  glRotatef((float)(this->super_SceneObject).rotation.x,0x3f800000,0,0);
  glRotatef((float)(this->super_SceneObject).rotation.y,0,0x3f800000,0);
  uVar7 = 0;
  glRotatef((float)(this->super_SceneObject).rotation.z,0,0,0x3f800000);
  glScalef((float)(this->super_SceneObject).scale.x,
           CONCAT44(uVar7,(float)(this->super_SceneObject).scale.y),
           (float)(this->super_SceneObject).scale.z);
  glDisable(0xbe2);
  glEnable(0xb50);
  draw_faces(this,false);
  glEnable(0xbe2);
  glBlendFunc(0x302,0x303);
  glDisable(0xb50);
  draw_edges(this);
  pSVar3 = (this->super_SceneObject).scene;
  if (pSVar3 != (Scene *)0x0) {
    draw_feature_if_needed(this,&pSVar3->selected);
    draw_feature_if_needed(this,&((this->super_SceneObject).scene)->hovered);
  }
  glEnable(0xb50);
  glDisable(0xbe2);
  glPopMatrix();
  lVar6 = 0;
  p_Var5 = (_List_node_base *)plVar1;
  while (p_Var5 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var5->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)plVar1) {
    Vector3D::operator-=
              ((Vector3D *)&p_Var5[1]._M_prev,
               (Vector3D *)((long)&(local_88._M_impl.super__Vector_impl_data._M_start)->x + lVar6));
    lVar6 = lVar6 + 0x18;
  }
  std::_Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

void Mesh::draw() {

  vector<Vector3D> offsets;

  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    Vector3D offset = v->offset * v->normal();
    offsets.push_back(offset);
  }

  int i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position += offsets[i++];
  }

  glPushMatrix();
  glTranslatef(position.x, position.y, position.z);
  glRotatef(rotation.x, 1.0f, 0.0f, 0.0f);
  glRotatef(rotation.y, 0.0f, 1.0f, 0.0f);
  glRotatef(rotation.z, 0.0f, 0.0f, 1.0f);
  glScalef(scale.x, scale.y, scale.z);

  glDisable( GL_BLEND );

	// Enable lighting for faces
  glEnable(GL_LIGHTING);
  draw_faces(false);

   glEnable( GL_BLEND );
   glBlendFunc( GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA );

  // Edges are drawn with flat shading.
  glDisable(GL_LIGHTING);
  draw_edges();

  // ONLY draw a vertex/half-edge if it's selected.
  if( scene )
  {
     draw_feature_if_needed( &scene->selected );
     draw_feature_if_needed( &scene->hovered );
  }

  glEnable(GL_LIGHTING);
  glDisable( GL_BLEND );

  glPopMatrix();

  i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position -= offsets[i++];
  }
}